

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  OfType OVar1;
  AssertionResult *pAVar2;
  Code colour;
  string *this_00;
  string local_50;
  allocator local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  printSourceInfo(this);
  pAVar2 = this->result;
  (this->itMessage)._M_current =
       (this->messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = (pAVar2->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    std::__cxx11::string::string((string *)&local_50,"passed",(allocator *)&local_28);
    printResultType(this,BrightGreen,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    printOriginalExpression(this);
    printReconstructedExpression(this);
    if ((this->result->m_info).capturedExpression._M_string_length != 0) goto LAB_00137983;
LAB_00137815:
    colour = None;
    goto LAB_00137989;
  case Info:
    std::__cxx11::string::string((string *)&local_50,"info",(allocator *)&local_28);
    printResultType(this,None,&local_50);
    goto LAB_001377af;
  case Warning:
    std::__cxx11::string::string((string *)&local_50,"warning",(allocator *)&local_28);
    printResultType(this,None,&local_50);
LAB_001377af:
    std::__cxx11::string::~string((string *)&local_50);
    printMessage(this);
LAB_00137983:
    colour = FileName;
LAB_00137989:
    printRemainingMessages(this,colour);
    break;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 == ExpressionFailed) {
        if (((pAVar2->m_info).resultDisposition & SuppressFail) == 0) {
          std::__cxx11::string::string((string *)&local_50,"failed",(allocator *)&local_28);
          printResultType(this,BrightRed,&local_50);
          this_00 = &local_50;
        }
        else {
          std::__cxx11::string::string((string *)&local_28," - but was ok",&local_29);
          std::operator+(&local_50,"failed",&local_28);
          printResultType(this,BrightGreen,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          this_00 = &local_28;
        }
        std::__cxx11::string::~string((string *)this_00);
        printOriginalExpression(this);
        printReconstructedExpression(this);
        goto LAB_00137983;
      }
      if (OVar1 == ExplicitFailure) {
        std::__cxx11::string::string((string *)&local_50,"failed",(allocator *)&local_28);
        printResultType(this,BrightRed,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&local_50,"explicitly",(allocator *)&local_28);
        printIssue(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_00137815;
      }
      if (OVar1 == Exception) goto switchD_001376ca_caseD_ffffffff;
      if (OVar1 == ThrewException) {
        std::__cxx11::string::string((string *)&local_50,"failed",(allocator *)&local_28);
        printResultType(this,BrightRed,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string
                  ((string *)&local_50,"unexpected exception with message:",(allocator *)&local_28);
        printIssue(this,&local_50);
LAB_00137872:
        std::__cxx11::string::~string((string *)&local_50);
        printMessage(this);
      }
      else {
        if (OVar1 != DidntThrowException) {
          if (OVar1 != FatalErrorCondition) {
            return;
          }
          std::__cxx11::string::string((string *)&local_50,"failed",(allocator *)&local_28);
          printResultType(this,BrightRed,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string
                    ((string *)&local_50,"fatal error condition with message:",
                     (allocator *)&local_28);
          printIssue(this,&local_50);
          goto LAB_00137872;
        }
        std::__cxx11::string::string((string *)&local_50,"failed",(allocator *)&local_28);
        printResultType(this,BrightRed,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string
                  ((string *)&local_50,"expected exception, got none",(allocator *)&local_28);
        printIssue(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      printExpressionWas(this);
      goto LAB_00137983;
    }
  case Unknown:
switchD_001376ca_caseD_ffffffff:
    std::__cxx11::string::string((string *)&local_50,"** internal error **",(allocator *)&local_28);
    printResultType(this,BrightRed,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::FatalErrorCondition:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "fatal error condition with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }